

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.c
# Opt level: O1

int updatewindow(z_streamp strm,Bytef *end,uint copy)

{
  uint uVar1;
  internal_state *piVar2;
  long lVar3;
  voidpf pvVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  
  piVar2 = strm->state;
  lVar3._0_1_ = piVar2->method;
  lVar3._1_3_ = *(undefined3 *)&piVar2->field_0x49;
  lVar3._4_4_ = piVar2->last_flush;
  if (lVar3 == 0) {
    pvVar4 = (*strm->zalloc)(strm->opaque,1 << (*(byte *)&piVar2->gzhead & 0x1f),1);
    *(voidpf *)&piVar2->method = pvVar4;
    if (pvVar4 == (voidpf)0x0) {
      return 1;
    }
  }
  if (*(int *)((long)&piVar2->gzhead + 4) == 0) {
    *(int *)((long)&piVar2->gzhead + 4) = 1 << (*(byte *)&piVar2->gzhead & 0x1f);
    piVar2->gzindex = 0;
  }
  uVar7 = *(uint *)((long)&piVar2->gzhead + 4);
  if (copy < uVar7) {
    uVar1 = *(uint *)((long)&piVar2->gzindex + 4);
    uVar7 = uVar7 - uVar1;
    uVar6 = copy;
    if (uVar7 < copy) {
      uVar6 = uVar7;
    }
    memcpy((void *)((ulong)uVar1 + *(long *)&piVar2->method),end + -(ulong)copy,(ulong)uVar6);
    if (copy <= uVar7) {
      uVar5 = *(int *)((long)&piVar2->gzindex + 4) + uVar6;
      uVar7 = *(uint *)((long)&piVar2->gzhead + 4);
      uVar1 = (uint)piVar2->gzindex;
      if (uVar5 == uVar7) {
        uVar5 = 0;
      }
      *(uint *)((long)&piVar2->gzindex + 4) = uVar5;
      if (uVar7 <= uVar1) {
        return 0;
      }
      *(uint *)&piVar2->gzindex = uVar1 + uVar6;
      return 0;
    }
    uVar6 = copy - uVar6;
    memcpy(*(void **)&piVar2->method,end + -(ulong)uVar6,(ulong)uVar6);
    *(uint *)((long)&piVar2->gzindex + 4) = uVar6;
  }
  else {
    memcpy(*(void **)&piVar2->method,end + -(ulong)uVar7,(ulong)uVar7);
    *(undefined4 *)((long)&piVar2->gzindex + 4) = 0;
  }
  *(undefined4 *)&piVar2->gzindex = *(undefined4 *)((long)&piVar2->gzhead + 4);
  return 0;
}

Assistant:

local int updatewindow(z_streamp strm, const Bytef *end, unsigned copy) {
    struct inflate_state FAR *state;
    unsigned dist;

    state = (struct inflate_state FAR *)strm->state;

    /* if it hasn't been done already, allocate space for the window */
    if (state->window == Z_NULL) {
        state->window = (unsigned char FAR *)
                        ZALLOC(strm, 1U << state->wbits,
                               sizeof(unsigned char));
        if (state->window == Z_NULL) return 1;
    }

    /* if window not in use yet, initialize */
    if (state->wsize == 0) {
        state->wsize = 1U << state->wbits;
        state->wnext = 0;
        state->whave = 0;
    }

    /* copy state->wsize or less output bytes into the circular window */
    if (copy >= state->wsize) {
        zmemcpy(state->window, end - state->wsize, state->wsize);
        state->wnext = 0;
        state->whave = state->wsize;
    }
    else {
        dist = state->wsize - state->wnext;
        if (dist > copy) dist = copy;
        zmemcpy(state->window + state->wnext, end - copy, dist);
        copy -= dist;
        if (copy) {
            zmemcpy(state->window, end - copy, copy);
            state->wnext = copy;
            state->whave = state->wsize;
        }
        else {
            state->wnext += dist;
            if (state->wnext == state->wsize) state->wnext = 0;
            if (state->whave < state->wsize) state->whave += dist;
        }
    }
    return 0;
}